

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

uint __thiscall Js::FunctionBody::GetNumberOfRecursiveCallSites(FunctionBody *this)

{
  bool bVar1;
  DynamicProfileInfo *this_00;
  uint local_18;
  uint local_14;
  uint recursiveCallSiteInlineInfo;
  uint recursiveInlineSpan;
  FunctionBody *this_local;
  
  local_14 = 0;
  local_18 = 0;
  bVar1 = HasDynamicProfileInfo(this);
  if (bVar1) {
    this_00 = Memory::WriteBarrierPtr<Js::DynamicProfileInfo>::operator->(&this->dynamicProfileInfo)
    ;
    local_18 = DynamicProfileInfo::GetRecursiveInlineInfo(this_00);
  }
  for (; local_18 != 0; local_18 = local_18 >> 1) {
    local_14 = (local_18 & 1) + local_14;
  }
  return local_14;
}

Assistant:

uint FunctionBody::GetNumberOfRecursiveCallSites()
    {
        uint recursiveInlineSpan = 0;
        uint recursiveCallSiteInlineInfo = 0;
#if ENABLE_PROFILE_INFO
        if (this->HasDynamicProfileInfo())
        {
            recursiveCallSiteInlineInfo = this->dynamicProfileInfo->GetRecursiveInlineInfo();
        }
#endif

        while (recursiveCallSiteInlineInfo)
        {
            recursiveInlineSpan += (recursiveCallSiteInlineInfo & 1);
            recursiveCallSiteInlineInfo >>= 1;
        }
        return recursiveInlineSpan;
    }